

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O3

QTextTable *
QTextTablePrivate::createTable
          (QTextDocumentPrivate *pieceTable,int pos,int rows,int cols,QTextTableFormat *tableFormat)

{
  QList<int> *this;
  long lVar1;
  int iVar2;
  int blockFormat;
  QTextObject *this_00;
  int pos_00;
  int iVar3;
  long in_FS_OFFSET;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::QTextFormat((QTextFormat *)local_68,(QTextFormat *)tableFormat);
  iVar2 = 0;
  if (cols != 1) {
    iVar2 = cols;
  }
  ::QVariant::QVariant((QVariant *)&local_58,iVar2);
  QTextFormat::setProperty((QTextFormat *)local_68,0x4100,(QVariant *)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QTextDocumentPrivate::createObject(pieceTable,(QTextFormat *)local_68,-1);
  this_00 = (QTextObject *)QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
  iVar2 = pieceTable->editBlock;
  pieceTable->editBlock = iVar2 + 1;
  if (iVar2 == 0) {
    pieceTable->revision = pieceTable->revision + 1;
  }
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_78);
  iVar2 = QTextObject::objectIndex(this_00);
  QTextFormat::setObjectIndex((QTextFormat *)local_78,iVar2);
  ::QVariant::QVariant((QVariant *)&local_58,3);
  QTextFormat::setProperty((QTextFormat *)local_78,0x2f00,(QVariant *)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
  iVar2 = QTextFormatCollection::indexForFormat(&pieceTable->formats,(QTextFormat *)local_78);
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_58);
  blockFormat = QTextFormatCollection::indexForFormat(&pieceTable->formats,(QTextFormat *)&local_58)
  ;
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  lVar1 = *(long *)&this_00->field_0x8;
  *(undefined1 *)(lVar1 + 0x109) = 1;
  local_58._0_4_ =
       QTextDocumentPrivate::insertBlock(pieceTable,(QChar)0xfdd0,pos,blockFormat,iVar2,MoveCursor);
  *(undefined4 *)(lVar1 + 0x84) = local_58._0_4_;
  this = (QList<int> *)(lVar1 + 0xb8);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)this,*(qsizetype *)(lVar1 + 200),(int *)local_58.data);
  QList<int>::end(this);
  pos_00 = pos + 1;
  if (1 < cols * rows) {
    iVar3 = cols * rows + -1;
    do {
      local_58._0_4_ =
           QTextDocumentPrivate::insertBlock
                     (pieceTable,(QChar)0xfdd0,pos_00,blockFormat,iVar2,MoveCursor);
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)this,*(qsizetype *)(lVar1 + 200),(int *)local_58.data);
      QList<int>::end(this);
      pos_00 = pos_00 + 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  iVar2 = QTextDocumentPrivate::insertBlock
                    (pieceTable,(QChar)0xfdd1,pos_00,blockFormat,iVar2,MoveCursor);
  *(int *)(lVar1 + 0x88) = iVar2;
  *(undefined2 *)(lVar1 + 0x108) = 1;
  QTextDocumentPrivate::endEditBlock(pieceTable);
  QTextFormat::~QTextFormat((QTextFormat *)local_78);
  QTextFormat::~QTextFormat((QTextFormat *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QTextTable *)this_00;
}

Assistant:

QTextTable *QTextTablePrivate::createTable(QTextDocumentPrivate *pieceTable, int pos, int rows, int cols, const QTextTableFormat &tableFormat)
{
    QTextTableFormat fmt = tableFormat;
    fmt.setColumns(cols);
    QTextTable *table = qobject_cast<QTextTable *>(pieceTable->createObject(fmt));
    Q_ASSERT(table);

    pieceTable->beginEditBlock();

//     qDebug("---> createTable: rows=%d, cols=%d at %d", rows, cols, pos);
    // add block after table
    QTextCharFormat charFmt;
    charFmt.setObjectIndex(table->objectIndex());
    charFmt.setObjectType(QTextFormat::TableCellObject);


    int charIdx = pieceTable->formatCollection()->indexForFormat(charFmt);
    int cellIdx = pieceTable->formatCollection()->indexForFormat(QTextBlockFormat());

    QTextTablePrivate *d = table->d_func();
    d->blockFragmentUpdates = true;

    d->fragment_start = pieceTable->insertBlock(QTextBeginningOfFrame, pos, cellIdx, charIdx);
    d->cells.append(d->fragment_start);
    ++pos;

    for (int i = 1; i < rows*cols; ++i) {
        d->cells.append(pieceTable->insertBlock(QTextBeginningOfFrame, pos, cellIdx, charIdx));
//      qDebug("      addCell at %d", pos);
        ++pos;
    }

    d->fragment_end = pieceTable->insertBlock(QTextEndOfFrame, pos, cellIdx, charIdx);
//  qDebug("      addEOR at %d", pos);
    ++pos;

    d->blockFragmentUpdates = false;
    d->dirty = true;

    pieceTable->endEditBlock();

    return table;
}